

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_font_renderer.cpp
# Opt level: O0

GlyphMetrics * __thiscall
StbFontRenderer::getGlyphMetrics
          (GlyphMetrics *__return_storage_ptr__,StbFontRenderer *this,GlyphIndex glyphIdx)

{
  GlyphMetrics *glyphMetrics;
  int local_24;
  int local_20;
  int yMax;
  int yMin;
  int xMax;
  int xMin;
  GlyphIndex glyphIdx_local;
  StbFontRenderer *this_local;
  
  xMax = glyphIdx;
  _xMin = this;
  dpfb::GlyphMetrics::GlyphMetrics(__return_storage_ptr__);
  stbtt_GetGlyphHMetrics(&this->font,xMax,&__return_storage_ptr__->advance,(int *)0x0);
  __return_storage_ptr__->advance = (int)((float)__return_storage_ptr__->advance * this->scale);
  stbtt_GetGlyphBitmapBox(&this->font,xMax,this->scale,this->scale,&yMin,&local_20,&yMax,&local_24);
  (__return_storage_ptr__->size).w = yMax - yMin;
  (__return_storage_ptr__->size).h = local_24 - local_20;
  (__return_storage_ptr__->offset).x = yMin;
  (__return_storage_ptr__->offset).y = -local_20;
  return __return_storage_ptr__;
}

Assistant:

dpfb::GlyphMetrics StbFontRenderer::getGlyphMetrics(
    dpfb::GlyphIndex glyphIdx) const
{
    dpfb::GlyphMetrics glyphMetrics;

    stbtt_GetGlyphHMetrics(
        &font, glyphIdx, &glyphMetrics.advance, nullptr);
    glyphMetrics.advance *= scale;

    int xMin, xMax, yMin, yMax;
    stbtt_GetGlyphBitmapBox(
        &font, glyphIdx, scale, scale, &xMin, &yMin, &xMax, &yMax);

    glyphMetrics.size.w = xMax - xMin;
    glyphMetrics.size.h = yMax - yMin;
    glyphMetrics.offset.x = xMin;

    // stbtt converts coordinates so y increases down.
    // Positive yMin in stbtt is negative yMax in FreeType.
    // We use FreeType's convention, so negate back.
    glyphMetrics.offset.y = -yMin;

    return glyphMetrics;
}